

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void testSAX(xmllintState *lint,char *filename)

{
  int iVar1;
  long lVar2;
  long local_30;
  xmlParserInputBufferPtr buf;
  xmlSchemaValidCtxtPtr vctxt;
  int ret;
  char *filename_local;
  xmllintState *lint_local;
  
  lint->callbacks = 0;
  if (lint->wxschemas == (xmlSchemaPtr)0x0) {
    if (lint->html == 0) {
      parseXml(lint,filename);
    }
    else {
      parseHtml(lint,filename);
    }
  }
  else {
    iVar1 = strcmp(filename,"-");
    if (iVar1 == 0) {
      local_30 = xmlParserInputBufferCreateFd(0);
    }
    else {
      local_30 = xmlParserInputBufferCreateFilename(filename,0);
    }
    if (local_30 != 0) {
      lVar2 = xmlSchemaNewValidCtxt(lint->wxschemas);
      if (lVar2 == 0) {
        lint->progresult = XMLLINT_ERR_MEM;
        xmlFreeParserInputBuffer(local_30);
      }
      else {
        xmlSchemaValidateSetFilename(lVar2,filename);
        iVar1 = xmlSchemaValidateStream(lVar2,local_30,0,lint->ctxt->sax,lint);
        if (lint->repeat == 1) {
          if (iVar1 == 0) {
            if (lint->quiet == 0) {
              fprintf((FILE *)lint->errStream,"%s validates\n",filename);
            }
          }
          else if (iVar1 < 1) {
            fprintf((FILE *)lint->errStream,"%s validation generated an internal error\n",filename);
            lint->progresult = XMLLINT_ERR_VALID;
          }
          else {
            fprintf((FILE *)lint->errStream,"%s fails to validate\n",filename);
            lint->progresult = XMLLINT_ERR_VALID;
          }
        }
        xmlSchemaFreeValidCtxt(lVar2);
      }
    }
  }
  return;
}

Assistant:

static void
testSAX(xmllintState *lint, const char *filename) {
    lint->callbacks = 0;

#ifdef LIBXML_SCHEMAS_ENABLED
    if (lint->wxschemas != NULL) {
        int ret;
	xmlSchemaValidCtxtPtr vctxt;
        xmlParserInputBufferPtr buf;

        if (strcmp(filename, "-") == 0)
            buf = xmlParserInputBufferCreateFd(STDIN_FILENO,
                    XML_CHAR_ENCODING_NONE);
        else
            buf = xmlParserInputBufferCreateFilename(filename,
                    XML_CHAR_ENCODING_NONE);
        if (buf == NULL)
            return;

	vctxt = xmlSchemaNewValidCtxt(lint->wxschemas);
        if (vctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            xmlFreeParserInputBuffer(buf);
            return;
        }
	xmlSchemaValidateSetFilename(vctxt, filename);

	ret = xmlSchemaValidateStream(vctxt, buf, 0, lint->ctxt->sax, lint);
	if (lint->repeat == 1) {
	    if (ret == 0) {
	        if (!lint->quiet) {
	            fprintf(lint->errStream, "%s validates\n", filename);
	        }
	    } else if (ret > 0) {
		fprintf(lint->errStream, "%s fails to validate\n", filename);
		lint->progresult = XMLLINT_ERR_VALID;
	    } else {
		fprintf(lint->errStream, "%s validation generated an internal error\n",
		       filename);
		lint->progresult = XMLLINT_ERR_VALID;
	    }
	}
	xmlSchemaFreeValidCtxt(vctxt);
    } else
#endif
#ifdef LIBXML_HTML_ENABLED
    if (lint->html) {
        parseHtml(lint, filename);
    } else
#endif
    {
        parseXml(lint, filename);
    }
}